

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O2

void secp256k1_fe_get_bounds(secp256k1_fe *r,int m)

{
  uint64_t uVar1;
  
  if (-1 < m) {
    uVar1 = (ulong)(uint)m * 0x1ffffffffffffe;
    r->n[0] = uVar1;
    r->n[1] = uVar1;
    r->n[2] = uVar1;
    r->n[3] = uVar1;
    r->n[4] = (ulong)(uint)m * 0x1fffffffffffe;
    r->magnitude = m;
    r->normalized = (uint)(m == 0);
    secp256k1_fe_verify(r);
    return;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/field_impl.h"
          ,0x1b1,"test condition failed: m >= 0");
  abort();
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_get_bounds(secp256k1_fe* r, int m) {
    VERIFY_CHECK(m >= 0);
    VERIFY_CHECK(m <= 32);

    secp256k1_fe_impl_get_bounds(r, m);
    r->magnitude = m;
    r->normalized = (m == 0);

    SECP256K1_FE_VERIFY(r);
}